

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_rwkv_wkv6(ggml_context *ctx,ggml_tensor *k,ggml_tensor *v,ggml_tensor *r,ggml_tensor *tf,
              ggml_tensor *td,ggml_tensor *state)

{
  long lVar1;
  long lVar2;
  _Bool _Var3;
  ggml_tensor *pgVar4;
  char *pcVar5;
  int line;
  int64_t ne [4];
  long local_58;
  long local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  _Var3 = ggml_is_contiguous_n(k,0);
  if (_Var3) {
    _Var3 = ggml_is_contiguous_n(v,0);
    if (_Var3) {
      _Var3 = ggml_is_contiguous_n(r,0);
      if (_Var3) {
        _Var3 = ggml_is_contiguous_n(tf,0);
        if (_Var3) {
          _Var3 = ggml_is_contiguous_n(td,0);
          if (_Var3) {
            _Var3 = ggml_is_contiguous_n(state,0);
            if (_Var3) {
              lVar1 = k->ne[0];
              if (((v->ne[0] == lVar1) && (local_58 = k->ne[1], v->ne[1] == local_58)) &&
                 (local_50 = k->ne[2], v->ne[2] == local_50)) {
                if (((r->ne[0] == lVar1) && (r->ne[1] == local_58)) && (r->ne[2] == local_50)) {
                  if (((td->ne[0] == lVar1) && (td->ne[1] == local_58)) && (td->ne[2] == local_50))
                  {
                    lVar2 = state->ne[1];
                    local_58 = local_58 * lVar1;
                    if (state->ne[0] * lVar2 * state->ne[2] * state->ne[3] -
                        local_58 * lVar1 * lVar2 == 0) {
                      local_50 = lVar2 * lVar1 + local_50;
                      local_48 = 1;
                      local_40 = 1;
                      pgVar4 = ggml_new_tensor_impl
                                         (ctx,GGML_TYPE_F32,4,&local_58,(ggml_tensor *)0x0,0);
                      pgVar4->op = GGML_OP_RWKV_WKV6;
                      pgVar4->src[0] = k;
                      pgVar4->src[1] = v;
                      pgVar4->src[2] = r;
                      pgVar4->src[3] = tf;
                      pgVar4->src[4] = td;
                      pgVar4->src[5] = state;
                      return pgVar4;
                    }
                    pcVar5 = "ggml_nelements(state) == S * S * H * n_seqs";
                    line = 0x128b;
                  }
                  else {
                    pcVar5 = "td->ne[0] == S && td->ne[1] == H && td->ne[2] == n_tokens";
                    line = 0x128a;
                  }
                }
                else {
                  pcVar5 = "r->ne[0] == S && r->ne[1] == H && r->ne[2] == n_tokens";
                  line = 0x1289;
                }
              }
              else {
                pcVar5 = "v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens";
                line = 0x1288;
              }
            }
            else {
              pcVar5 = "ggml_is_contiguous(state)";
              line = 0x1281;
            }
          }
          else {
            pcVar5 = "ggml_is_contiguous(td)";
            line = 0x1280;
          }
        }
        else {
          pcVar5 = "ggml_is_contiguous(tf)";
          line = 0x127f;
        }
      }
      else {
        pcVar5 = "ggml_is_contiguous(r)";
        line = 0x127e;
      }
    }
    else {
      pcVar5 = "ggml_is_contiguous(v)";
      line = 0x127d;
    }
  }
  else {
    pcVar5 = "ggml_is_contiguous(k)";
    line = 0x127c;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

struct ggml_tensor * ggml_rwkv_wkv6(
        struct ggml_context * ctx,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * r,
        struct ggml_tensor  * tf,
        struct ggml_tensor  * td,
        struct ggml_tensor  * state) {
    GGML_ASSERT(ggml_is_contiguous(k));
    GGML_ASSERT(ggml_is_contiguous(v));
    GGML_ASSERT(ggml_is_contiguous(r));
    GGML_ASSERT(ggml_is_contiguous(tf));
    GGML_ASSERT(ggml_is_contiguous(td));
    GGML_ASSERT(ggml_is_contiguous(state));

    const int64_t S = k->ne[0];
    const int64_t H = k->ne[1];
    const int64_t n_tokens = k->ne[2];
    const int64_t n_seqs = state->ne[1];
    {
        GGML_ASSERT(v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens);
        GGML_ASSERT(r->ne[0] == S && r->ne[1] == H && r->ne[2] == n_tokens);
        GGML_ASSERT(td->ne[0] == S && td->ne[1] == H && td->ne[2] == n_tokens);
        GGML_ASSERT(ggml_nelements(state) == S * S * H * n_seqs);
    }

    // concat output and new_state
    const int64_t ne[4] = { S * H, n_tokens + S * n_seqs, 1, 1 };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    result->op     = GGML_OP_RWKV_WKV6;
    result->src[0] = k;
    result->src[1] = v;
    result->src[2] = r;
    result->src[3] = tf;
    result->src[4] = td;
    result->src[5] = state;

    return result;
}